

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesWidget.cxx
# Opt level: O3

void __thiscall cmCursesWidget::~cmCursesWidget(cmCursesWidget *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_cmCursesWidget = (_func_int **)&PTR__cmCursesWidget_00849db8;
  if (this->Field != (FIELD *)0x0) {
    free_field(this->Field);
    this->Field = (FIELD *)0x0;
  }
  pcVar1 = (this->Value)._M_dataplus._M_p;
  paVar2 = &(this->Value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCursesWidget::~cmCursesWidget()
{
  if (this->Field) {
    free_field(this->Field);
    this->Field = nullptr;
  }
}